

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
libtorrent::(anonymous_namespace)::get_file_attrs_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,file_flags_t flags,
          bool include_symlinks)

{
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> bVar1;
  bool bVar2;
  bool local_71;
  bitfield_flag local_5b;
  uchar local_5a;
  uchar local_59;
  bitfield_flag local_58;
  uchar local_57;
  uchar local_56;
  bitfield_flag local_55 [18];
  uchar local_43;
  uchar local_42;
  bitfield_flag local_41;
  undefined1 local_40 [8];
  string attr;
  bitfield_flag local_13;
  byte local_12;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_11;
  bool include_symlinks_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *poStack_10;
  file_flags_t flags_local;
  
  local_12 = flags.m_val & 1;
  attr.field_2._M_local_buf[0xf] = '\x02';
  local_11.m_val = (uchar)this;
  poStack_10 = __return_storage_ptr__;
  bVar1 = libtorrent::flags::operator|
                    ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\x01',
                     (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\x02');
  attr.field_2._M_local_buf[0xe] = '\x04';
  bVar1 = libtorrent::flags::operator|
                    (bVar1,(bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\x04');
  attr.field_2._M_local_buf[0xd] = '\b';
  bVar1 = libtorrent::flags::operator|
                    (bVar1,(bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\b');
  local_13 = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)(uchar)this,
                        bVar1);
  bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_13);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    ::std::__cxx11::string::string((string *)local_40);
    local_42 = local_11.m_val;
    local_43 = '\x01';
    local_41 = (bitfield_flag)
               libtorrent::flags::operator&
                         (local_11,(bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                                   '\x01');
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_41);
    if (bVar2) {
      ::std::__cxx11::string::operator+=((string *)local_40,'p');
    }
    local_56 = local_11.m_val;
    local_57 = '\x02';
    local_55[0] = (bitfield_flag)
                  libtorrent::flags::operator&
                            (local_11,(bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>
                                       )'\x02');
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(local_55);
    if (bVar2) {
      ::std::__cxx11::string::operator+=((string *)local_40,'h');
    }
    local_59 = local_11.m_val;
    local_5a = '\x04';
    local_58 = (bitfield_flag)
               libtorrent::flags::operator&
                         (local_11,(bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                                   '\x04');
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_58);
    if (bVar2) {
      ::std::__cxx11::string::operator+=((string *)local_40,'x');
    }
    local_71 = false;
    if ((local_12 & 1) != 0) {
      local_5b = (bitfield_flag)
                 libtorrent::flags::operator&
                           (local_11,(bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>
                                     )'\b');
      local_71 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_5b);
    }
    if (local_71 != false) {
      ::std::__cxx11::string::operator+=((string *)local_40,'l');
    }
    ::std::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    ::std::__cxx11::string::~string((string *)local_40);
  }
  else {
    ::std::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> get_file_attrs(file_flags_t const flags, bool const include_symlinks)
	{
		if (!(flags & (file_storage::flag_pad_file
			| file_storage::flag_hidden
			| file_storage::flag_executable
			| file_storage::flag_symlink)))
		{
			return std::nullopt;
		}
		std::string attr;
		if (flags & file_storage::flag_pad_file) attr += 'p';
		if (flags & file_storage::flag_hidden) attr += 'h';
		if (flags & file_storage::flag_executable) attr += 'x';
		if (include_symlinks && (flags & file_storage::flag_symlink)) attr += 'l';
		return attr;
	}